

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::handle
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  CompilerMSL *pCVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *pSVar4;
  pointer ppVar5;
  Variant *this_00;
  mapped_type *pmVar6;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  uint32_t local_e0;
  mapped_type local_dc;
  uint32_t result_id;
  uint32_t result_type;
  uint32_t local_d0;
  uint32_t ptr;
  uint32_t id;
  uint32_t result_type_1;
  undefined1 local_c0;
  uint32_t local_b4;
  SPIRVariable *local_b0;
  SPIRVariable *var_1;
  undefined1 local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_98;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_90;
  iterator it_2;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_78;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_70;
  iterator it_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_58;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_50;
  iterator it;
  SPIRVariable *var;
  SPVFuncImpl local_28;
  uint32_t local_24;
  SPVFuncImpl spv_func;
  uint32_t length_local;
  uint32_t *args_local;
  OpCodePreprocessor *pOStack_10;
  Op opcode_local;
  OpCodePreprocessor *this_local;
  
  local_24 = length;
  _spv_func = args;
  args_local._4_4_ = opcode;
  pOStack_10 = this;
  local_28 = get_spv_func_impl(this,opcode,args);
  if (local_28 != SPVFuncImplNone) {
    ::std::
    set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
    ::insert(&this->compiler->spv_function_implementations,&local_28);
    this->suppress_missing_prototypes = true;
  }
  if (args_local._4_4_ == OpFunctionCall) {
    this->suppress_missing_prototypes = true;
  }
  else if (args_local._4_4_ == OpImageTexelPointer) {
    pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,_spv_func[2]);
    if (pSVar4 == (SPIRVariable *)0x0) {
      TypedID<(spirv_cross::Types)0>::TypedID
                ((TypedID<(spirv_cross::Types)0> *)
                 ((long)&it.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 4),0);
    }
    else {
      it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_
           = (pSVar4->super_IVariant).self.id;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)
                       ((long)&it.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                               ._M_cur + 4));
    pmVar6 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->image_pointers,_spv_func + 1);
    *pmVar6 = uVar3;
  }
  else if (args_local._4_4_ == OpStore) {
    check_resource_write(this,*_spv_func);
  }
  else if (args_local._4_4_ - OpAccessChain < 3) {
    ptr = *_spv_func;
    local_d0 = _spv_func[1];
    result_type = _spv_func[2];
    result_id._3_1_ = 1;
    Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              ((Compiler *)this->compiler,local_d0,(char (*) [1])0x4d8596,&ptr,
               (bool *)((long)&result_id + 3));
    Compiler::register_read((Compiler *)this->compiler,local_d0,result_type,true);
    this_00 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>,(ulong)local_d0);
    Variant::set_allow_type_rewrite(this_00);
  }
  else if (args_local._4_4_ == OpArrayLength) {
    local_b0 = Compiler::maybe_get_backing_variable((Compiler *)this->compiler,_spv_func[2]);
    if (local_b0 != (SPIRVariable *)0x0) {
      pCVar1 = this->compiler;
      local_b4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_b0->super_IVariant).self)
      ;
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&pCVar1->buffers_requiring_array_length,&local_b4);
      _id = (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_c0 = pVar7.second;
    }
  }
  else if (args_local._4_4_ == OpImageWrite) {
    this->uses_resource_write = true;
  }
  else if (args_local._4_4_ == OpAtomicLoad) {
    this->uses_atomics = true;
    local_90._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers,_spv_func + 2);
    local_98._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers);
    bVar2 = ::std::__detail::operator!=(&local_90,&local_98);
    if (bVar2) {
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_90);
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&pCVar1->atomic_image_vars,&ppVar5->second);
      var_1 = (SPIRVariable *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_a0 = pVar7.second;
    }
  }
  else if (args_local._4_4_ == OpAtomicStore) {
    this->uses_atomics = true;
    local_70._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers,_spv_func);
    local_78._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers);
    bVar2 = ::std::__detail::operator!=(&local_70,&local_78);
    if (bVar2) {
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_70);
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&pCVar1->atomic_image_vars,&ppVar5->second);
      it_2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    check_resource_write(this,*_spv_func);
  }
  else if (args_local._4_4_ - OpAtomicExchange < 0xe) {
    this->uses_atomics = true;
    local_50._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::find(&this->image_pointers,_spv_func + 2);
    local_58._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         ::end(&this->image_pointers);
    bVar2 = ::std::__detail::operator!=(&local_50,&local_58);
    if (bVar2) {
      pCVar1 = this->compiler;
      ppVar5 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                           *)&local_50);
      pVar7 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert(&pCVar1->atomic_image_vars,&ppVar5->second);
      it_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
           (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
           pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    }
    check_resource_write(this,_spv_func[2]);
  }
  else if (args_local._4_4_ == OpGroupNonUniformInverseBallot) {
    this->needs_subgroup_invocation_id = true;
  }
  else if ((args_local._4_4_ == OpGroupNonUniformBallotBitCount) && (_spv_func[3] != 0)) {
    this->needs_subgroup_invocation_id = true;
  }
  bVar2 = Compiler::instruction_to_result_type
                    ((Compiler *)this->compiler,&local_dc,&local_e0,args_local._4_4_,_spv_func,
                     local_24);
  if (bVar2) {
    pmVar6 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->result_types,&local_e0);
    *pmVar6 = local_dc;
  }
  return true;
}

Assistant:

bool CompilerMSL::OpCodePreprocessor::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// Since MSL exists in a single execution scope, function prototype declarations are not
	// needed, and clutter the output. If secondary functions are output (either as a SPIR-V
	// function implementation or as indicated by the presence of OpFunctionCall), then set
	// suppress_missing_prototypes to suppress compiler warnings of missing function prototypes.

	// Mark if the input requires the implementation of an SPIR-V function that does not exist in Metal.
	SPVFuncImpl spv_func = get_spv_func_impl(opcode, args);
	if (spv_func != SPVFuncImplNone)
	{
		compiler.spv_function_implementations.insert(spv_func);
		suppress_missing_prototypes = true;
	}

	switch (opcode)
	{

	case OpFunctionCall:
		suppress_missing_prototypes = true;
		break;

	// Emulate texture2D atomic operations
	case OpImageTexelPointer:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		image_pointers[args[1]] = var ? var->self : ID(0);
		break;
	}

	case OpImageWrite:
		uses_resource_write = true;
		break;

	case OpStore:
		check_resource_write(args[0]);
		break;

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[2]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		check_resource_write(args[2]);
		break;
	}

	case OpAtomicStore:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[0]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		check_resource_write(args[0]);
		break;
	}

	case OpAtomicLoad:
	{
		uses_atomics = true;
		auto it = image_pointers.find(args[2]);
		if (it != image_pointers.end())
		{
			compiler.atomic_image_vars.insert(it->second);
		}
		break;
	}

	case OpGroupNonUniformInverseBallot:
		needs_subgroup_invocation_id = true;
		break;

	case OpGroupNonUniformBallotBitCount:
		if (args[3] != GroupOperationReduce)
			needs_subgroup_invocation_id = true;
		break;

	case OpArrayLength:
	{
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
			compiler.buffers_requiring_array_length.insert(var->self);
		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		// OpArrayLength might want to know if taking ArrayLength of an array of SSBOs.
		uint32_t result_type = args[0];
		uint32_t id = args[1];
		uint32_t ptr = args[2];

		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	default:
		break;
	}

	// If it has one, keep track of the instruction's result type, mapped by ID
	uint32_t result_type, result_id;
	if (compiler.instruction_to_result_type(result_type, result_id, opcode, args, length))
		result_types[result_id] = result_type;

	return true;
}